

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

ALCenum anon_unknown.dwarf_65b09::EnumFromDevFmt(DevFmtType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *this;
  byte in_DIL;
  undefined3 in_stack_ffffffffffffffa8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffac;
  string local_28 [20];
  int in_stack_ffffffffffffffec;
  ALCenum local_4;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_DIL;
  switch(__rhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    local_4 = 0x1400;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    local_4 = 0x1401;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    local_4 = 0x1402;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    local_4 = 0x1403;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    local_4 = 0x1404;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    local_4 = 0x1405;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    local_4 = 0x1406;
    break;
  default:
    uVar1 = CONCAT13(1,in_stack_ffffffffffffffa8);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffffec);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffffac,uVar1),__rhs);
    std::runtime_error::runtime_error(this,local_28);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

ALCenum EnumFromDevFmt(DevFmtType type)
{
    switch(type)
    {
    case DevFmtByte: return ALC_BYTE_SOFT;
    case DevFmtUByte: return ALC_UNSIGNED_BYTE_SOFT;
    case DevFmtShort: return ALC_SHORT_SOFT;
    case DevFmtUShort: return ALC_UNSIGNED_SHORT_SOFT;
    case DevFmtInt: return ALC_INT_SOFT;
    case DevFmtUInt: return ALC_UNSIGNED_INT_SOFT;
    case DevFmtFloat: return ALC_FLOAT_SOFT;
    }
    throw std::runtime_error{"Invalid DevFmtType: "+std::to_string(int(type))};
}